

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O2

void Minisat::selectionSort<unsigned_int,reduceDB_tch>(uint *array,int size,reduceDB_tch lt)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  reduceDB_tch lt_local;
  
  iVar2 = 1;
  if (1 < size) {
    iVar2 = size;
  }
  uVar6 = 1;
  lt_local.ca = lt.ca;
  for (uVar4 = 0; uVar4 != iVar2 - 1; uVar4 = uVar4 + 1) {
    uVar8 = uVar4 & 0xffffffff;
    uVar5 = uVar6;
    while( true ) {
      uVar7 = (uint)uVar8;
      if ((uint)size == uVar5) break;
      bVar1 = reduceDB_tch::operator()(&lt_local,array[uVar5],array[(int)uVar7]);
      uVar3 = (uint)uVar5;
      if (!bVar1) {
        uVar3 = uVar7;
      }
      uVar5 = uVar5 + 1;
      uVar8 = (ulong)uVar3;
    }
    uVar3 = array[uVar4];
    array[uVar4] = array[(int)uVar7];
    array[(int)uVar7] = uVar3;
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

void selectionSort(T *array, int size, LessThan lt)
{
    int i, j, best_i;
    T tmp;

    for (i = 0; i < size - 1; i++) {
        best_i = i;
        for (j = i + 1; j < size; j++) {
            if (lt(array[j], array[best_i])) best_i = j;
        }
        tmp = array[i];
        array[i] = array[best_i];
        array[best_i] = tmp;
    }
}